

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O3

int run_test_tmpdir(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  int *piVar7;
  undefined8 uVar8;
  char *unaff_RBX;
  ulong *puVar9;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char tmpdir [4096];
  ulong uStack_1ea0;
  ulong uStack_1e98;
  int iStack_1e90;
  int iStack_1e8c;
  undefined1 auStack_1e88 [8];
  long alStack_1e80 [7];
  byte bStack_1e46;
  undefined8 auStack_1d68 [7];
  uint uStack_1d30;
  undefined1 auStack_1c50 [808];
  long *plStack_1928;
  code *pcStack_1920;
  long lStack_1918;
  long lStack_1910;
  long alStack_1908 [35];
  long alStack_17f0 [35];
  long alStack_16d8 [35];
  long alStack_15c0 [101];
  code *pcStack_1298;
  long lStack_1288;
  long lStack_1280;
  uint uStack_1278;
  uint uStack_1274;
  ulong auStack_1270 [35];
  ulong auStack_1158 [35];
  char *pcStack_1040;
  undefined8 local_1010;
  char local_1008 [4096];
  
  local_1010 = 0x1000;
  local_1008[0] = '\0';
  sVar5 = strlen(local_1008);
  if (sVar5 == 0) {
    iVar1 = uv_os_tmpdir(local_1008,&local_1010);
    if (iVar1 != 0) goto LAB_001d8354;
    unaff_RBX = local_1008;
    sVar5 = strlen(unaff_RBX);
    if (sVar5 != local_1010) goto LAB_001d8363;
    if ((long)local_1010 < 1) goto LAB_001d8372;
    if (local_1008[local_1010] != '\0') goto LAB_001d8381;
    if ((local_1010 < 2) || (unaff_RBX[local_1010 - 1] != '/')) {
      local_1010 = 1;
      iVar1 = uv_os_tmpdir(local_1008);
      if (iVar1 != -0x69) goto LAB_001d8390;
      if ((long)local_1010 < 2) goto LAB_001d839f;
      iVar1 = uv_os_tmpdir(0,&local_1010);
      if (iVar1 != -0x16) goto LAB_001d83ae;
      iVar1 = uv_os_tmpdir(local_1008,0);
      if (iVar1 != -0x16) goto LAB_001d83bd;
      local_1010 = 0;
      iVar1 = uv_os_tmpdir(local_1008);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_001d83cc;
    }
  }
  else {
    run_test_tmpdir_cold_1();
LAB_001d8354:
    run_test_tmpdir_cold_2();
LAB_001d8363:
    run_test_tmpdir_cold_3();
LAB_001d8372:
    run_test_tmpdir_cold_4();
LAB_001d8381:
    run_test_tmpdir_cold_5();
LAB_001d8390:
    run_test_tmpdir_cold_6();
LAB_001d839f:
    run_test_tmpdir_cold_7();
LAB_001d83ae:
    run_test_tmpdir_cold_8();
LAB_001d83bd:
    run_test_tmpdir_cold_9();
LAB_001d83cc:
    run_test_tmpdir_cold_10();
  }
  run_test_tmpdir_cold_11();
  pcStack_1298 = (code *)0x1d83fc;
  pcStack_1040 = unaff_RBX;
  plVar6 = (long *)uv_default_loop();
  pcStack_1298 = (code *)0x1d8411;
  uVar2 = open64("/dev/tty",0,0);
  if ((int)uVar2 < 0) {
    pcStack_1298 = (code *)0x1d8844;
    run_test_tty_cold_24();
    return 7;
  }
  piVar7 = (int *)(ulong)uVar2;
  pcStack_1298 = (code *)0x1d8431;
  iVar1 = open64("/dev/tty",1,0);
  if (iVar1 < 0) {
    pcStack_1298 = (code *)0x1d884e;
    run_test_tty_cold_23();
    return 7;
  }
  auStack_1270[0] = 0;
  auStack_1158[0] = 0;
  pcStack_1298 = (code *)0x1d849e;
  uVar3 = uv_guess_handle(0xffffffff);
  auStack_1270[0] = (ulong)uVar3;
  if (auStack_1158[0] == auStack_1270[0]) {
    auStack_1158[0] = 0xe;
    pcStack_1298 = (code *)0x1d84cc;
    uVar2 = uv_guess_handle(uVar2);
    auStack_1270[0] = (ulong)uVar2;
    if (auStack_1158[0] != auStack_1270[0]) goto LAB_001d8889;
    auStack_1158[0] = 0xe;
    pcStack_1298 = (code *)0x1d84f9;
    uVar2 = uv_guess_handle(iVar1);
    auStack_1270[0] = (ulong)uVar2;
    if (auStack_1158[0] != auStack_1270[0]) goto LAB_001d889b;
    pcStack_1298 = (code *)0x1d852b;
    iVar4 = uv_tty_init(plVar6,auStack_1158,piVar7,1);
    auStack_1270[0] = (ulong)iVar4;
    lStack_1288 = 0;
    if (auStack_1270[0] != 0) goto LAB_001d88ad;
    pcStack_1298 = (code *)0x1d8558;
    iVar4 = uv_is_readable(auStack_1158);
    if (iVar4 == 0) goto LAB_001d88bc;
    pcStack_1298 = (code *)0x1d856d;
    iVar4 = uv_is_writable(auStack_1158);
    if (iVar4 != 0) goto LAB_001d88c1;
    pcStack_1298 = (code *)0x1d8586;
    iVar1 = uv_tty_init(plVar6,auStack_1270,iVar1,0);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d88c6;
    pcStack_1298 = (code *)0x1d85b0;
    iVar1 = uv_is_readable(auStack_1270);
    if (iVar1 != 0) goto LAB_001d88d5;
    pcStack_1298 = (code *)0x1d85c2;
    iVar1 = uv_is_writable(auStack_1270);
    if (iVar1 == 0) goto LAB_001d88da;
    pcStack_1298 = (code *)0x1d85de;
    iVar1 = uv_tty_get_winsize(auStack_1270,&uStack_1274,&uStack_1278);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d88df;
    pcStack_1298 = (code *)0x1d8614;
    printf("width=%d height=%d\n",(ulong)uStack_1274,(ulong)uStack_1278);
    if (uStack_1274 == 0 && uStack_1278 == 0) {
      pcStack_1298 = (code *)0x1d8634;
      uv_walk(plVar6,close_walk_cb,0);
      pcStack_1298 = (code *)0x1d863e;
      uv_run(plVar6,0);
      lStack_1288 = 0;
      pcStack_1298 = (code *)0x1d864f;
      iVar1 = uv_loop_close(plVar6);
      lStack_1280 = (long)iVar1;
      if (lStack_1288 == lStack_1280) {
        pcStack_1298 = (code *)0x1d866b;
        uv_library_shutdown();
        return 7;
      }
      goto LAB_001d88ee;
    }
    lStack_1280 = 0;
    lStack_1288 = (long)(int)uStack_1274;
    if ((long)(int)uStack_1274 < 1) goto LAB_001d88fd;
    lStack_1288 = (long)(int)uStack_1278;
    lStack_1280 = 0;
    if (lStack_1288 < 1) goto LAB_001d890c;
    pcStack_1298 = (code *)0x1d86c6;
    iVar1 = uv_tty_set_mode(auStack_1158,1);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d891b;
    pcStack_1298 = (code *)0x1d86f5;
    iVar1 = uv_tty_set_mode(auStack_1158,0);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d892a;
    pcStack_1298 = (code *)0x1d871a;
    piVar7 = __errno_location();
    *piVar7 = 0;
    pcStack_1298 = (code *)0x1d8728;
    iVar1 = uv_tty_reset_mode();
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d8939;
    pcStack_1298 = (code *)0x1d874d;
    iVar1 = uv_tty_reset_mode();
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d8948;
    pcStack_1298 = (code *)0x1d8772;
    iVar1 = uv_tty_reset_mode();
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d8957;
    lStack_1288 = (long)*piVar7;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d8966;
    piVar7 = (int *)0x0;
    pcStack_1298 = (code *)0x1d87c5;
    uv_close(auStack_1158,0);
    pcStack_1298 = (code *)0x1d87d1;
    uv_close(auStack_1270,0);
    pcStack_1298 = (code *)0x1d87db;
    uv_run(plVar6,0);
    pcStack_1298 = (code *)0x1d87e0;
    plVar6 = (long *)uv_default_loop();
    pcStack_1298 = (code *)0x1d87f4;
    uv_walk(plVar6,close_walk_cb,0);
    pcStack_1298 = (code *)0x1d87fe;
    uv_run(plVar6,0);
    lStack_1288 = 0;
    pcStack_1298 = (code *)0x1d880c;
    uVar8 = uv_default_loop();
    pcStack_1298 = (code *)0x1d8814;
    iVar1 = uv_loop_close(uVar8);
    lStack_1280 = (long)iVar1;
    if (lStack_1288 == lStack_1280) {
      pcStack_1298 = (code *)0x1d8830;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1298 = (code *)0x1d8889;
    run_test_tty_cold_1();
LAB_001d8889:
    pcStack_1298 = (code *)0x1d889b;
    run_test_tty_cold_2();
LAB_001d889b:
    pcStack_1298 = (code *)0x1d88ad;
    run_test_tty_cold_3();
LAB_001d88ad:
    pcStack_1298 = (code *)0x1d88bc;
    run_test_tty_cold_4();
LAB_001d88bc:
    pcStack_1298 = (code *)0x1d88c1;
    run_test_tty_cold_20();
LAB_001d88c1:
    pcStack_1298 = (code *)0x1d88c6;
    run_test_tty_cold_5();
LAB_001d88c6:
    pcStack_1298 = (code *)0x1d88d5;
    run_test_tty_cold_6();
LAB_001d88d5:
    pcStack_1298 = (code *)0x1d88da;
    run_test_tty_cold_7();
LAB_001d88da:
    pcStack_1298 = (code *)0x1d88df;
    run_test_tty_cold_19();
LAB_001d88df:
    pcStack_1298 = (code *)0x1d88ee;
    run_test_tty_cold_8();
LAB_001d88ee:
    pcStack_1298 = (code *)0x1d88fd;
    run_test_tty_cold_18();
LAB_001d88fd:
    pcStack_1298 = (code *)0x1d890c;
    run_test_tty_cold_9();
LAB_001d890c:
    pcStack_1298 = (code *)0x1d891b;
    run_test_tty_cold_10();
LAB_001d891b:
    pcStack_1298 = (code *)0x1d892a;
    run_test_tty_cold_11();
LAB_001d892a:
    pcStack_1298 = (code *)0x1d8939;
    run_test_tty_cold_12();
LAB_001d8939:
    pcStack_1298 = (code *)0x1d8948;
    run_test_tty_cold_13();
LAB_001d8948:
    pcStack_1298 = (code *)0x1d8957;
    run_test_tty_cold_14();
LAB_001d8957:
    pcStack_1298 = (code *)0x1d8966;
    run_test_tty_cold_15();
LAB_001d8966:
    pcStack_1298 = (code *)0x1d8975;
    run_test_tty_cold_16();
  }
  pcStack_1298 = run_test_tty_file;
  run_test_tty_cold_17();
  pcStack_1920 = (code *)0x1d8999;
  pcStack_1298 = (code *)plVar6;
  iVar1 = uv_loop_init(alStack_15c0);
  alStack_16d8[0] = (long)iVar1;
  alStack_17f0[0] = 0;
  if (alStack_16d8[0] == 0) {
    pcStack_1920 = (code *)0x1d89d5;
    uVar2 = open64("test/fixtures/empty_file",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d8a08;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] != alStack_1908[0]) goto LAB_001d8edf;
      pcStack_1920 = (code *)0x1d8a29;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] != 0) goto LAB_001d8ef1;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d8a77;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] == alStack_1908[0]) goto LAB_001d8a91;
      goto LAB_001d8f15;
    }
LAB_001d8a91:
    pcStack_1920 = (code *)0x1d8aa1;
    uVar2 = open64("/dev/random",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d8ad0;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] != alStack_1908[0]) goto LAB_001d8f03;
      pcStack_1920 = (code *)0x1d8af1;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] == 0) goto LAB_001d8b17;
      goto LAB_001d8f27;
    }
LAB_001d8b17:
    pcStack_1920 = (code *)0x1d8b27;
    uVar2 = open64("/dev/zero",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d8b56;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] != alStack_1908[0]) goto LAB_001d8f39;
      pcStack_1920 = (code *)0x1d8b77;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] == 0) goto LAB_001d8b9d;
      goto LAB_001d8f4b;
    }
LAB_001d8b9d:
    pcStack_1920 = (code *)0x1d8bb0;
    uVar2 = open64("/dev/tty",2);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      pcStack_1920 = (code *)0x1d8bd7;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] != 0) goto LAB_001d8f5d;
      pcStack_1920 = (code *)0x1d8c04;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] != 0) goto LAB_001d8f6f;
      pcStack_1920 = (code *)0x1d8c37;
      iVar1 = uv_is_readable(alStack_16d8);
      if (iVar1 == 0) goto LAB_001d8f81;
      pcStack_1920 = (code *)0x1d8c4c;
      iVar1 = uv_is_writable(alStack_16d8);
      if (iVar1 == 0) goto LAB_001d8f86;
      plVar6 = alStack_16d8;
      pcStack_1920 = (code *)0x1d8c66;
      uv_close(plVar6);
      pcStack_1920 = (code *)0x1d8c6e;
      iVar1 = uv_is_readable(plVar6);
      if (iVar1 != 0) goto LAB_001d8f98;
      pcStack_1920 = (code *)0x1d8c83;
      iVar1 = uv_is_writable(alStack_16d8);
      if (iVar1 == 0) goto LAB_001d8c8b;
      goto LAB_001d8faa;
    }
LAB_001d8c8b:
    pcStack_1920 = (code *)0x1d8c9b;
    uVar2 = open64("/dev/tty",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      pcStack_1920 = (code *)0x1d8cc2;
      iVar1 = uv_tty_init(alStack_15c0,alStack_17f0,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      lStack_1918 = 0;
      if (alStack_1908[0] != 0) goto LAB_001d8f8b;
      pcStack_1920 = (code *)0x1d8ce7;
      iVar1 = close(uVar2);
      alStack_1908[0] = (long)iVar1;
      lStack_1918 = 0;
      if (alStack_1908[0] != 0) goto LAB_001d8f9d;
      pcStack_1920 = (code *)0x1d8d12;
      iVar1 = uv_is_readable(alStack_17f0);
      if (iVar1 == 0) goto LAB_001d8faf;
      pcStack_1920 = (code *)0x1d8d27;
      iVar1 = uv_is_writable(alStack_17f0);
      if (iVar1 != 0) goto LAB_001d8fb4;
      plVar6 = alStack_17f0;
      pcStack_1920 = (code *)0x1d8d41;
      uv_close(plVar6,0);
      pcStack_1920 = (code *)0x1d8d49;
      iVar1 = uv_is_readable(plVar6);
      if (iVar1 != 0) goto LAB_001d8fc6;
      pcStack_1920 = (code *)0x1d8d5e;
      iVar1 = uv_is_writable(alStack_17f0);
      if (iVar1 == 0) goto LAB_001d8d66;
      goto LAB_001d8fd8;
    }
LAB_001d8d66:
    pcStack_1920 = (code *)0x1d8d79;
    uVar2 = open64("/dev/tty",1);
    if (uVar2 == 0xffffffff) {
LAB_001d8e32:
      pcStack_1920 = (code *)0x1d8e41;
      iVar1 = uv_run(alStack_15c0,0);
      lStack_1918 = (long)iVar1;
      lStack_1910 = 0;
      if (lStack_1918 != 0) goto LAB_001d8ec5;
      plVar6 = alStack_15c0;
      pcStack_1920 = (code *)0x1d8e74;
      uv_walk(plVar6,close_walk_cb,0);
      pcStack_1920 = (code *)0x1d8e7e;
      uv_run(plVar6,0);
      lStack_1918 = 0;
      pcStack_1920 = (code *)0x1d8e8e;
      iVar1 = uv_loop_close(plVar6);
      lStack_1910 = (long)iVar1;
      if (lStack_1918 == lStack_1910) {
        pcStack_1920 = (code *)0x1d8ea5;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d8ed2;
    }
    plVar6 = (long *)(ulong)uVar2;
    pcStack_1920 = (code *)0x1d8d9a;
    iVar1 = uv_tty_init(alStack_15c0,alStack_1908,uVar2,0);
    lStack_1918 = (long)iVar1;
    lStack_1910 = 0;
    if (lStack_1918 != 0) goto LAB_001d8fb9;
    pcStack_1920 = (code *)0x1d8dbf;
    iVar1 = close(uVar2);
    lStack_1918 = (long)iVar1;
    lStack_1910 = 0;
    if (lStack_1918 != 0) goto LAB_001d8fcb;
    pcStack_1920 = (code *)0x1d8de7;
    iVar1 = uv_is_readable(alStack_1908);
    if (iVar1 != 0) goto LAB_001d8fdd;
    pcStack_1920 = (code *)0x1d8df9;
    iVar1 = uv_is_writable(alStack_1908);
    if (iVar1 == 0) goto LAB_001d8fe2;
    plVar6 = alStack_1908;
    pcStack_1920 = (code *)0x1d8e10;
    uv_close(plVar6,0);
    pcStack_1920 = (code *)0x1d8e18;
    iVar1 = uv_is_readable(plVar6);
    if (iVar1 != 0) goto LAB_001d8fe7;
    pcStack_1920 = (code *)0x1d8e2a;
    iVar1 = uv_is_writable(alStack_1908);
    if (iVar1 == 0) goto LAB_001d8e32;
  }
  else {
    pcStack_1920 = (code *)0x1d8ec5;
    run_test_tty_file_cold_1();
LAB_001d8ec5:
    pcStack_1920 = (code *)0x1d8ed2;
    run_test_tty_file_cold_27();
LAB_001d8ed2:
    pcStack_1920 = (code *)0x1d8edf;
    run_test_tty_file_cold_28();
LAB_001d8edf:
    pcStack_1920 = (code *)0x1d8ef1;
    run_test_tty_file_cold_2();
LAB_001d8ef1:
    pcStack_1920 = (code *)0x1d8f03;
    run_test_tty_file_cold_3();
LAB_001d8f03:
    pcStack_1920 = (code *)0x1d8f15;
    run_test_tty_file_cold_5();
LAB_001d8f15:
    pcStack_1920 = (code *)0x1d8f27;
    run_test_tty_file_cold_4();
LAB_001d8f27:
    pcStack_1920 = (code *)0x1d8f39;
    run_test_tty_file_cold_6();
LAB_001d8f39:
    pcStack_1920 = (code *)0x1d8f4b;
    run_test_tty_file_cold_7();
LAB_001d8f4b:
    pcStack_1920 = (code *)0x1d8f5d;
    run_test_tty_file_cold_8();
LAB_001d8f5d:
    pcStack_1920 = (code *)0x1d8f6f;
    run_test_tty_file_cold_9();
LAB_001d8f6f:
    pcStack_1920 = (code *)0x1d8f81;
    run_test_tty_file_cold_10();
LAB_001d8f81:
    pcStack_1920 = (code *)0x1d8f86;
    run_test_tty_file_cold_14();
LAB_001d8f86:
    pcStack_1920 = (code *)0x1d8f8b;
    run_test_tty_file_cold_13();
LAB_001d8f8b:
    pcStack_1920 = (code *)0x1d8f98;
    run_test_tty_file_cold_15();
LAB_001d8f98:
    pcStack_1920 = (code *)0x1d8f9d;
    run_test_tty_file_cold_11();
LAB_001d8f9d:
    pcStack_1920 = (code *)0x1d8faa;
    run_test_tty_file_cold_16();
LAB_001d8faa:
    pcStack_1920 = (code *)0x1d8faf;
    run_test_tty_file_cold_12();
LAB_001d8faf:
    pcStack_1920 = (code *)0x1d8fb4;
    run_test_tty_file_cold_20();
LAB_001d8fb4:
    pcStack_1920 = (code *)0x1d8fb9;
    run_test_tty_file_cold_17();
LAB_001d8fb9:
    pcStack_1920 = (code *)0x1d8fc6;
    run_test_tty_file_cold_21();
LAB_001d8fc6:
    pcStack_1920 = (code *)0x1d8fcb;
    run_test_tty_file_cold_18();
LAB_001d8fcb:
    pcStack_1920 = (code *)0x1d8fd8;
    run_test_tty_file_cold_22();
LAB_001d8fd8:
    pcStack_1920 = (code *)0x1d8fdd;
    run_test_tty_file_cold_19();
LAB_001d8fdd:
    pcStack_1920 = (code *)0x1d8fe2;
    run_test_tty_file_cold_23();
LAB_001d8fe2:
    pcStack_1920 = (code *)0x1d8fe7;
    run_test_tty_file_cold_26();
LAB_001d8fe7:
    pcStack_1920 = (code *)0x1d8fec;
    run_test_tty_file_cold_24();
  }
  pcStack_1920 = run_test_tty_pty;
  run_test_tty_file_cold_25();
  puVar9 = &uStack_1ea0;
  plStack_1928 = plVar6;
  pcStack_1920 = (code *)piVar7;
  iVar1 = uv_loop_init(auStack_1c50);
  alStack_1e80[0] = (long)iVar1;
  auStack_1d68[0] = 0;
  if (alStack_1e80[0] == 0) {
    iVar1 = openpty(&iStack_1e8c,&iStack_1e90,0,0,auStack_1e88);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 7;
    }
    iVar1 = uv_tty_init(auStack_1c50,auStack_1d68,iStack_1e90,0);
    alStack_1e80[0] = (long)iVar1;
    uStack_1ea0 = 0;
    if (alStack_1e80[0] != 0) goto LAB_001d924f;
    iVar1 = uv_tty_init(auStack_1c50,alStack_1e80,iStack_1e8c,0);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d925c;
    iVar1 = uv_is_readable(auStack_1d68);
    if (iVar1 == 0) goto LAB_001d9269;
    iVar1 = uv_is_writable(auStack_1d68);
    if (iVar1 == 0) goto LAB_001d926e;
    iVar1 = uv_is_readable(alStack_1e80);
    if (iVar1 == 0) goto LAB_001d9273;
    iVar1 = uv_is_writable(alStack_1e80);
    if (iVar1 == 0) goto LAB_001d9278;
    uStack_1ea0 = (ulong)(uStack_1d30 & 0x100000);
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d927d;
    if ((bStack_1e46 & 0x10) == 0) goto LAB_001d928a;
    iVar1 = close(iStack_1e90);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d928f;
    uv_close(auStack_1d68,0);
    iVar1 = close(iStack_1e8c);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d929c;
    uv_close(alStack_1e80,0);
    iVar1 = uv_run(auStack_1c50,0);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 == 0) {
      uv_walk(auStack_1c50,close_walk_cb,0);
      uv_run(auStack_1c50,0);
      uStack_1ea0 = 0;
      iVar1 = uv_loop_close(auStack_1c50);
      uStack_1e98 = (ulong)iVar1;
      if (uStack_1ea0 == uStack_1e98) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d92b6;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d924f:
    run_test_tty_pty_cold_3();
LAB_001d925c:
    run_test_tty_pty_cold_4();
LAB_001d9269:
    run_test_tty_pty_cold_14();
LAB_001d926e:
    run_test_tty_pty_cold_13();
LAB_001d9273:
    run_test_tty_pty_cold_12();
LAB_001d9278:
    run_test_tty_pty_cold_11();
LAB_001d927d:
    run_test_tty_pty_cold_5();
LAB_001d928a:
    run_test_tty_pty_cold_10();
LAB_001d928f:
    run_test_tty_pty_cold_6();
LAB_001d929c:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d92b6:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar9,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT_OK(strlen(tmpdir));
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(tmpdir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(tmpdir[len], '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT_NE(last, '\\');
#else
    ASSERT_NE(last, '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_EQ(r, UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT_OK(r);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT_OK(r);
#endif

  return 0;
}